

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo_x86.c
# Opt level: O0

void FillX86BrandString(char *brand_string)

{
  long in_RDI;
  Leaf LVar1;
  uint32_t max_cpuid_leaf_ext;
  Leaf leaf_ext_0;
  
  LVar1 = CpuId(0);
  SetString(LVar1.edx,LVar1.ecx,LVar1._0_8_);
  SetString(LVar1.edx,LVar1.ecx,LVar1._0_8_);
  SetString(LVar1.edx,LVar1.ecx,LVar1._0_8_);
  *(undefined1 *)(in_RDI + 0x30) = 0;
  return;
}

Assistant:

void FillX86BrandString(char brand_string[49]) {
  const Leaf leaf_ext_0 = CpuId(0x80000000);
  const uint32_t max_cpuid_leaf_ext = leaf_ext_0.eax;
  SetString(max_cpuid_leaf_ext, 0x80000002, brand_string);
  SetString(max_cpuid_leaf_ext, 0x80000003, brand_string + 16);
  SetString(max_cpuid_leaf_ext, 0x80000004, brand_string + 32);
  brand_string[48] = '\0';
}